

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_tester.cpp
# Opt level: O2

unsigned_long delete_section(char **p,unsigned_long start,unsigned_long length,unsigned_long size)

{
  char *pcVar1;
  runtime_error *this;
  ulong __size;
  
  __size = size - length;
  if ((length <= size && __size != 0) && (__size < size)) {
    for (; pcVar1 = *p, __size != start; start = start + 1) {
      pcVar1[start] = pcVar1[length + start];
    }
    pcVar1 = (char *)realloc(pcVar1,__size);
    *p = pcVar1;
    return __size;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"invalid delete_section call");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unsigned long delete_section(char*& p, unsigned long start, unsigned long length, unsigned long size)
{	
	unsigned long new_size = size - length;
	if(new_size >= size || size <= length || (size - (start + length)) < 0) throw runtime_error("invalid delete_section call");

	for(unsigned long x = 0; x < size - (start + length); x++) p[start + x] = p[start + length + x];

	p = (char*) realloc(p, new_size);

	return new_size;
}